

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall L14_3::Singer::set_data(Singer *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  int local_14;
  int i;
  Singer *this_local;
  
  std::operator<<((ostream *)&std::cout,"Enter number for singer\'s vocal range:\n");
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_14);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,*(char **)(pv + (long)local_14 * 8));
    std::operator<<(poVar4," ");
    if (local_14 % 4 == 3) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  if (local_14 % 4 != 0) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    plVar5 = (long *)std::istream::operator>>(&std::cin,&this->_voice);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    bVar1 = false;
    if ((bVar2) && (bVar1 = true, -1 < this->_voice)) {
      bVar1 = 4 < this->_voice;
    }
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"Please enter a value in range [0, ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,5);
    std::operator<<(poVar4,");\n");
  }
  do {
    iVar3 = std::istream::get();
  } while (iVar3 != 10);
  return;
}

Assistant:

void Singer::set_data() {
        std::cout << "Enter number for singer's vocal range:\n";
        //  output available vocals
        int i;
        for (i = 0; i < VoiceType; i++) {
            std::cout << i << ": " << pv[i] << " ";
            if (i % 4 == 3) {
                std::cout << std::endl;
            }
        }
        if (i % 4 != 0) {
            std::cout << std::endl;
        }
        //  只能输入 [0~VoiceType)范围内的数值
        while(std::cin >> _voice && (_voice < 0 || _voice >= VoiceType)) {
            std::cout << "Please enter a value in range [0, " << VoiceType << ");\n";
        }
        while(std::cin.get() != '\n') {
            continue;
        }
    }